

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

SplitNDLayerParams * __thiscall
CoreML::Specification::SplitNDLayerParams::New(SplitNDLayerParams *this,Arena *arena)

{
  SplitNDLayerParams *this_00;
  
  this_00 = (SplitNDLayerParams *)operator_new(0x40);
  SplitNDLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SplitNDLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SplitNDLayerParams* SplitNDLayerParams::New(::google::protobuf::Arena* arena) const {
  SplitNDLayerParams* n = new SplitNDLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}